

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSkylineNSymStructMatrix.cpp
# Opt level: O2

void __thiscall
TPZSkylineNSymStructMatrix<double,_TPZStructMatrixOT<double>_>::TPZSkylineNSymStructMatrix
          (TPZSkylineNSymStructMatrix<double,_TPZStructMatrixOT<double>_> *this,TPZCompMesh *cmesh)

{
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOT<double>_>).field_0x160 = 0x17ec720
  ;
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOT<double>_>).
    super_TPZStructMatrixT<double>.super_TPZStructMatrix = 0x17ec7e8;
  *(undefined4 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOT<double>_>).field_0x168 = 0;
  (this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOT<double>_>).field_0x16c = 1;
  TPZSkylineStructMatrix<double,_TPZStructMatrixOT<double>_>::TPZStructMatrix
            (&this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOT<double>_>,
             &PTR_construction_vtable_104__017eb378,cmesh);
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOT<double>_>).field_0x160 = 0x17eb300
  ;
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOT<double>_>).
    super_TPZStructMatrixT<double>.super_TPZStructMatrix = 0x17eb130;
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOT<double>_>).
    super_TPZStructMatrixT<double>.super_TPZStructMatrix.field_0xa0 = 0x17eb1f8;
  return;
}

Assistant:

TPZSkylineNSymStructMatrix<TVar,TPar>::TPZSkylineNSymStructMatrix(TPZCompMesh *cmesh)
  : TPZSkylineStructMatrix<TVar,TPar>(cmesh)
{
  ///nothing here
}